

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O1

void Nf_ManSetDefaultPars(Jf_Par_t *pPars)

{
  memset(pPars,0,0xf8);
  pPars->nLutSize = 6;
  pPars->nCutNum = 0x10;
  pPars->nProcNum = 0;
  pPars->nRounds = 4;
  pPars->nRoundsEla = 2;
  pPars->nRelaxRatio = 0;
  pPars->nCoarseLimit = 3;
  pPars->nAreaTuner = 0;
  pPars->nReqTimeFlex = 0;
  pPars->nVerbLimit = 5;
  pPars->DelayTarget = -1;
  pPars->fAreaOnly = 0;
  pPars->fPinPerm = 0;
  pPars->fPinQuick = 0;
  pPars->fPinFilter = 0;
  pPars->fOptEdge = 1;
  pPars->fCoarsen = 0;
  pPars->fCutMin = 1;
  pPars->fGenCnf = 0;
  pPars->fPureAig = 0;
  pPars->fVerbose = 0;
  pPars->fVeryVerbose = 0;
  pPars->nLutSizeMax = 6;
  pPars->nCutNumMax = 0x20;
  pPars->WordMapDelayTarget = 0;
  return;
}

Assistant:

void Nf_ManSetDefaultPars( Jf_Par_t * pPars )
{
    memset( pPars, 0, sizeof(Jf_Par_t) );
    pPars->nLutSize     =  6;
    pPars->nCutNum      = 16;
    pPars->nProcNum     =  0;
    pPars->nRounds      =  4;
    pPars->nRoundsEla   =  2;
    pPars->nRelaxRatio  =  0;
    pPars->nCoarseLimit =  3;
    pPars->nAreaTuner   =  0;
    pPars->nReqTimeFlex =  0;
    pPars->nVerbLimit   =  5;
    pPars->DelayTarget  = -1;
    pPars->fAreaOnly    =  0;
    pPars->fPinPerm     =  0;
    pPars->fPinQuick    =  0;
    pPars->fPinFilter   =  0;
    pPars->fOptEdge     =  1; 
    pPars->fCoarsen     =  0;
    pPars->fCutMin      =  1;
    pPars->fGenCnf      =  0;
    pPars->fPureAig     =  0;
    pPars->fVerbose     =  0;
    pPars->fVeryVerbose =  0;
    pPars->nLutSizeMax  =  NF_LEAF_MAX;
    pPars->nCutNumMax   =  NF_CUT_MAX;
    pPars->WordMapDelayTarget = 0;
}